

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genDependentAggLoopString
          (string *__return_storage_ptr__,CppGenerator *this,TDNode *node,size_t currentLoop,
          size_t depth,dyn_bitset *contributingViews,size_t maxDepth,string *resetString)

{
  pointer pDVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pDVar4;
  size_t *psVar5;
  pointer pvVar6;
  pointer pAVar7;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  bool bVar8;
  size_type sVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  View *pVVar13;
  Attribute *pAVar14;
  View *pVVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  pointer pAVar19;
  size_t aggID;
  long lVar20;
  string *psVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  AggregateIndexes *pAVar22;
  size_t *psVar23;
  ulong uVar24;
  byte bVar25;
  bitset<7UL> increasingIndexes;
  string local_5e0;
  string closeLoopString;
  size_t off;
  size_t local_570;
  string local_568;
  string loopString;
  string local_4f0;
  size_t local_4d0;
  string productString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  long local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  size_type local_190;
  size_t local_188;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_180;
  ulong local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  size_t outViewID;
  string depthString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar25 = 0;
  local_188 = maxDepth;
  pDVar1 = (this->depListOfLoops).super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_180 = &pDVar1[currentLoop].loopFactors;
  sVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(local_180);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&productString);
  std::__cxx11::to_string(&depthString,depth);
  local_458 = depth + sVar9;
  sVar10 = depth + sVar9 + 3;
  lVar20 = 0;
  local_570 = depth;
  local_190 = sVar9;
  for (uVar24 = 0;
      pvVar2 = (this->localProductList).
               super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar17 = *(long *)&pvVar2[currentLoop].
                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                         ._M_impl.super__Vector_impl_data,
      uVar24 < (ulong)(((long)*(pointer *)
                               ((long)&pvVar2[currentLoop].
                                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar17) / 0xc0);
      uVar24 = uVar24 + 1) {
    genProductString_abi_cxx11_
              (&productString,this,node,contributingViews,(prod_bitset *)(lVar17 + lVar20));
    offset_abi_cxx11_(&local_4f0,this,sVar10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                   &local_4f0,"localRegister[");
    std::__cxx11::to_string(&local_568,this->productCounter);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &increasingIndexes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                   &local_568);
    std::operator+(&local_5e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &increasingIndexes,"] = ");
    std::operator+(&closeLoopString,&local_5e0,&productString);
    std::operator+(&loopString,&closeLoopString,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&loopString);
    std::__cxx11::string::~string((string *)&closeLoopString);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&increasingIndexes);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&off);
    std::__cxx11::string::~string((string *)&local_4f0);
    sVar18 = this->productCounter;
    *(size_t *)
     (*(long *)&(this->depLocalProductRemapping).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data + uVar24 * 8) = sVar18;
    this->productCounter = sVar18 + 1;
    std::__cxx11::string::~string((string *)&productString);
    lVar20 = lVar20 + 0xc0;
  }
  lVar20 = 0xc;
  uVar24 = 0;
  while( true ) {
    pvVar3 = (this->newAggregateRegister).
             super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar17 = *(long *)&pvVar3[currentLoop].
                       super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                       super__Vector_impl_data;
    if ((ulong)(((long)*(pointer *)
                        ((long)&pvVar3[currentLoop].
                                super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                                _M_impl.super__Vector_impl_data + 8) - lVar17) / 0x70) <= uVar24)
    break;
    if (*(char *)(lVar17 + -0x1f + lVar20 * 8) == '\x01') {
      offset_abi_cxx11_(&local_5e0,this,sVar10);
      std::operator+(&closeLoopString,&local_5e0,"aggregateRegister[");
      std::__cxx11::to_string((string *)&increasingIndexes,this->aggregateCounter);
      std::operator+(&loopString,&closeLoopString,(string *)&increasingIndexes);
      std::operator+(&productString,&loopString,"] = ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&productString);
      std::__cxx11::string::~string((string *)&loopString);
      std::__cxx11::string::~string((string *)&increasingIndexes);
      std::__cxx11::string::~string((string *)&closeLoopString);
      std::__cxx11::string::~string((string *)&local_5e0);
      uVar16 = *(ulong *)(lVar17 + -0x60 + lVar20 * 8);
      if (uVar16 < (ulong)(((long)(this->depListOfLoops).
                                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->depListOfLoops).
                                 super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                                 _M_impl.super__Vector_impl_data._M_start) / 0x138)) {
        std::__cxx11::to_string
                  (&productString,
                   *(unsigned_long *)
                    (*(long *)&(this->depAggregateRemapping).
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data +
                    *(long *)(lVar17 + -0x58 + lVar20 * 8) * 8));
        std::operator+(&closeLoopString,"aggregateRegister[",&productString);
        std::operator+(&loopString,&closeLoopString,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&loopString);
        std::__cxx11::string::~string((string *)&closeLoopString);
        std::__cxx11::string::~string((string *)&productString);
      }
      if (*(char *)(lVar17 + -0x50 + lVar20 * 8) == '\x01') {
        std::__cxx11::to_string
                  (&productString,
                   *(unsigned_long *)
                    (*(long *)&(this->depLocalProductRemapping).
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data +
                    *(long *)(lVar17 + -0x48 + lVar20 * 8) * 8));
        std::operator+(&closeLoopString,"localRegister[",&productString);
        std::operator+(&loopString,&closeLoopString,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&loopString);
        std::__cxx11::string::~string((string *)&closeLoopString);
        std::__cxx11::string::~string((string *)&productString);
      }
      if (*(char *)(lVar17 + -0xf + lVar20 * 8) == '\x01') {
        std::operator+(&local_5e0,"aggregates_",this->viewName + *(long *)(lVar17 + -8 + lVar20 * 8)
                      );
        std::operator+(&closeLoopString,&local_5e0,"[");
        std::__cxx11::to_string
                  ((string *)&increasingIndexes,*(unsigned_long *)(lVar17 + lVar20 * 8));
        std::operator+(&loopString,&closeLoopString,(string *)&increasingIndexes);
        std::operator+(&productString,&loopString,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&productString);
        std::__cxx11::string::~string((string *)&loopString);
        std::__cxx11::string::~string((string *)&increasingIndexes);
        std::__cxx11::string::~string((string *)&closeLoopString);
        std::__cxx11::string::~string((string *)&local_5e0);
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      sVar18 = this->aggregateCounter;
      *(size_t *)
       (*(long *)&(this->depAggregateRemapping).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data + uVar24 * 8) = sVar18;
      this->aggregateCounter = sVar18 + 1;
    }
    uVar24 = uVar24 + 1;
    lVar20 = lVar20 + 0xe;
  }
  local_4d0 = local_458 + 4;
  uVar24 = 0;
  while( true ) {
    b = local_180;
    lVar20 = *(long *)&pDVar1[currentLoop].next.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pDVar1[currentLoop].next.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl + 8) - lVar20 >> 3) <= uVar24) break;
    sVar18 = *(size_t *)(lVar20 + uVar24 * 8);
    pDVar4 = (this->depListOfLoops).
             super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_178 = uVar24;
    boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&productString
                     ,&pDVar4[sVar18].loopFactors,local_180);
    bVar8 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &productString,b);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&productString);
    if (!bVar8) break;
    uVar24 = pDVar4[sVar18].loopVariable;
    std::__cxx11::string::string((string *)&productString,"",(allocator *)&loopString);
    std::__cxx11::string::string((string *)&loopString,"",(allocator *)&closeLoopString);
    std::__cxx11::string::string((string *)&closeLoopString,"",(allocator *)&local_5e0);
    sVar11 = QueryCompiler::numberOfViews
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    if (uVar24 < sVar11) {
      offset_abi_cxx11_(&local_50,this,sVar10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outViewID
                     ,&local_50,"ptr_");
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outViewID
                     ,this->viewName + uVar24);
      std::operator+(&local_2f0,&local_f0," = lowerptr_");
      std::operator+(&local_2d0,&local_2f0,this->viewName + uVar24);
      std::operator+(&local_2b0,&local_2d0,"[");
      std::operator+(&local_290,&local_2b0,&depthString);
      std::operator+(&local_3d0,&local_290,"];\n");
      offset_abi_cxx11_(&local_70,this,sVar10);
      std::operator+(&local_170,&local_3d0,&local_70);
      std::operator+(&local_270,&local_170,"while(ptr_");
      std::operator+(&local_150,&local_270,this->viewName + uVar24);
      std::operator+(&local_250,&local_150," <= upperptr_");
      std::operator+(&local_3b0,&local_250,this->viewName + uVar24);
      std::operator+(&local_390,&local_3b0,"[");
      std::operator+(&local_230,&local_390,&depthString);
      std::operator+(&local_370,&local_230,"])\n");
      offset_abi_cxx11_(&local_90,this,sVar10);
      std::operator+(&local_210,&local_370,&local_90);
      std::operator+(&local_350,&local_210,"{\n");
      offset_abi_cxx11_(&local_b0,this,local_4d0);
      std::operator+(&local_330,&local_350,&local_b0);
      std::operator+(&local_1f0,&local_330,this->viewName + uVar24);
      std::operator+(&local_1d0,&local_1f0,"_tuple &");
      std::operator+(&local_310,&local_1d0,this->viewName + uVar24);
      std::operator+(&local_1b0,&local_310,"Tuple = ");
      std::operator+(&local_410,&local_1b0,this->viewName + uVar24);
      std::operator+(&local_3f0,&local_410,"[ptr_");
      std::operator+(&local_450,&local_3f0,this->viewName + uVar24);
      std::operator+(&local_478,&local_450,"];\n");
      offset_abi_cxx11_(&local_d0,this,local_4d0);
      std::operator+(&local_430,&local_478,&local_d0);
      std::operator+(&local_568,&local_430,"double *aggregates_");
      std::operator+(&local_4f0,&local_568,this->viewName + uVar24);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                     &local_4f0," = ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                     this->viewName + uVar24);
      std::operator+(&local_5e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,"Tuple.aggregates;\n");
      std::__cxx11::string::append((string *)&loopString);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&increasingIndexes);
      std::__cxx11::string::~string((string *)&off);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&outViewID);
      std::__cxx11::string::~string((string *)&local_50);
      offset_abi_cxx11_(&local_478,this,local_4d0);
      std::operator+(&local_430,&local_478,"++ptr_");
      std::operator+(&local_568,&local_430,this->viewName + uVar24);
      std::operator+(&local_4f0,&local_568,";\n");
      offset_abi_cxx11_(&local_450,this,sVar10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                     &local_4f0,&local_450);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,"}\n"
                    );
      std::operator+(&local_5e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,&closeLoopString);
      std::__cxx11::string::append((string *)&closeLoopString);
      std::__cxx11::string::~string((string *)&local_5e0);
    }
    else {
      offset_abi_cxx11_(&local_290,this,sVar10);
      std::operator+(&local_3d0,&local_290,"ptr_");
      std::operator+(&local_170,&local_3d0,&node->_name);
      std::operator+(&local_270,&local_170," = lowerptr_");
      std::operator+(&local_150,&local_270,&node->_name);
      std::operator+(&local_250,&local_150,"[");
      std::operator+(&local_3b0,&local_250,&depthString);
      std::operator+(&local_390,&local_3b0,"];\n");
      offset_abi_cxx11_(&local_2b0,this,sVar10);
      std::operator+(&local_230,&local_390,&local_2b0);
      std::operator+(&local_370,&local_230,"while(ptr_");
      std::operator+(&local_210,&local_370,&node->_name);
      std::operator+(&local_350,&local_210," <= upperptr_");
      std::operator+(&local_330,&local_350,&node->_name);
      std::operator+(&local_1f0,&local_330,"[");
      std::operator+(&local_1d0,&local_1f0,&depthString);
      std::operator+(&local_310,&local_1d0,"])\n");
      offset_abi_cxx11_(&local_2d0,this,sVar10);
      std::operator+(&local_1b0,&local_310,&local_2d0);
      std::operator+(&local_410,&local_1b0,"{\n");
      offset_abi_cxx11_(&local_2f0,this,local_4d0);
      std::operator+(&local_3f0,&local_410,&local_2f0);
      std::operator+(&local_450,&local_3f0,&node->_name);
      std::operator+(&local_478,&local_450,"_tuple &");
      std::operator+(&local_430,&local_478,&node->_name);
      std::operator+(&local_568,&local_430,"Tuple = ");
      std::operator+(&local_4f0,&local_568,&node->_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                     &local_4f0,"[ptr_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                     &node->_name);
      std::operator+(&local_5e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,"];\n");
      std::__cxx11::string::append((string *)&loopString);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&increasingIndexes);
      std::__cxx11::string::~string((string *)&off);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_290);
      offset_abi_cxx11_(&local_478,this,local_4d0);
      std::operator+(&local_430,&local_478,"++ptr_");
      std::operator+(&local_568,&local_430,&node->_name);
      std::operator+(&local_4f0,&local_568,";\n");
      offset_abi_cxx11_(&local_450,this,sVar10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                     &local_4f0,&local_450);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,"}\n"
                    );
      std::operator+(&local_5e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,&closeLoopString);
      std::__cxx11::string::operator=((string *)&closeLoopString,(string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_5e0);
    }
    std::__cxx11::string::~string((string *)&increasingIndexes);
    std::__cxx11::string::~string((string *)&off);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_478);
    genDependentAggLoopString
              (&local_5e0,this,node,sVar18,local_570,contributingViews,local_188,&productString);
    std::__cxx11::string::append((string *)&loopString);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &increasingIndexes,&productString,&loopString);
    std::operator+(&local_5e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &increasingIndexes,&closeLoopString);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&increasingIndexes);
    lVar20 = 8;
    uVar24 = 0;
    while( true ) {
      pvVar3 = (this->newAggregateRegister).
               super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = *(long *)&pvVar3[sVar18].
                         super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                         super__Vector_impl_data;
      if ((ulong)(((long)*(pointer *)
                          ((long)&pvVar3[sVar18].
                                  super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar17) / 0x70) <= uVar24)
      break;
      if (*(char *)(lVar17 + lVar20 * 8) == '\x01') {
        offset_abi_cxx11_(&local_4f0,this,sVar10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                       &local_4f0,"aggregateRegister[");
        std::__cxx11::to_string(&local_568,this->aggregateCounter);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &increasingIndexes,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                       &local_568);
        std::operator+(&local_5e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &increasingIndexes,"] = ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_5e0);
        std::__cxx11::string::~string((string *)&increasingIndexes);
        std::__cxx11::string::~string((string *)&local_568);
        std::__cxx11::string::~string((string *)&off);
        std::__cxx11::string::~string((string *)&local_4f0);
        uVar16 = *(ulong *)(lVar17 + -0x40 + lVar20 * 8);
        uVar12 = ((long)(this->depListOfLoops).
                        super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->depListOfLoops).
                       super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x138;
        if (uVar16 < uVar12) {
          std::__cxx11::to_string
                    (&local_5e0,
                     *(unsigned_long *)
                      (*(long *)(*(long *)&(this->newAggregateRemapping).
                                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_570].
                                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar16 * 0x18) +
                      *(long *)(lVar17 + -0x38 + lVar20 * 8) * 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                         "aggregateRegister[",&local_5e0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &increasingIndexes,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                         "]*");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&increasingIndexes);
          std::__cxx11::string::~string((string *)&off);
          std::__cxx11::string::~string((string *)&local_5e0);
          uVar12 = ((long)(this->depListOfLoops).
                          super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->depListOfLoops).
                         super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x138;
        }
        uVar16 = *(ulong *)(lVar17 + -0x10 + lVar20 * 8);
        if (uVar16 < uVar12) {
          std::__cxx11::to_string
                    (&local_5e0,
                     *(unsigned_long *)
                      (*(long *)(*(long *)&(this->newAggregateRemapping).
                                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_570].
                                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar16 * 0x18) +
                      *(long *)(lVar17 + -8 + lVar20 * 8) * 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                         "aggregateRegister[",&local_5e0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &increasingIndexes,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                         "]*");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&increasingIndexes);
          std::__cxx11::string::~string((string *)&off);
          std::__cxx11::string::~string((string *)&local_5e0);
        }
        std::__cxx11::string::pop_back();
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        sVar11 = this->aggregateCounter;
        *(size_t *)
         (*(long *)&(this->depAggregateRemapping).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar18].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + uVar24 * 8) = sVar11;
        this->aggregateCounter = sVar11 + 1;
      }
      uVar24 = uVar24 + 1;
      lVar20 = lVar20 + 0xe;
    }
    std::__cxx11::string::~string((string *)&closeLoopString);
    std::__cxx11::string::~string((string *)&loopString);
    std::__cxx11::string::~string((string *)&productString);
    uVar24 = local_178 + 1;
  }
  sVar18 = local_570;
  uVar24 = this->aggregateCounter;
  lVar20 = 0xc;
  uVar12 = 0;
  uVar16 = uVar24;
  while( true ) {
    pvVar3 = (this->newAggregateRegister).
             super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar17 = *(long *)&pvVar3[currentLoop].
                       super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                       super__Vector_impl_data;
    if ((ulong)(((long)*(pointer *)
                        ((long)&pvVar3[currentLoop].
                                super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                                _M_impl.super__Vector_impl_data + 8) - lVar17) / 0x70) <= uVar12)
    break;
    if ((*(char *)(lVar17 + -0x20 + lVar20 * 8) == '\0') &&
       (*(char *)(lVar17 + -0x1f + lVar20 * 8) == '\0')) {
      offset_abi_cxx11_(&local_5e0,this,sVar10);
      std::operator+(&closeLoopString,&local_5e0,"aggregateRegister[");
      std::__cxx11::to_string((string *)&increasingIndexes,this->aggregateCounter);
      std::operator+(&loopString,&closeLoopString,(string *)&increasingIndexes);
      std::operator+(&productString,&loopString,"] += ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&productString);
      std::__cxx11::string::~string((string *)&loopString);
      std::__cxx11::string::~string((string *)&increasingIndexes);
      std::__cxx11::string::~string((string *)&closeLoopString);
      std::__cxx11::string::~string((string *)&local_5e0);
      uVar16 = *(ulong *)(lVar17 + -0x60 + lVar20 * 8);
      if (uVar16 < (ulong)(((long)(this->depListOfLoops).
                                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->depListOfLoops).
                                 super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                                 _M_impl.super__Vector_impl_data._M_start) / 0x138)) {
        std::__cxx11::to_string
                  (&productString,
                   *(unsigned_long *)
                    (*(long *)&(this->depAggregateRemapping).
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data +
                    *(long *)(lVar17 + -0x58 + lVar20 * 8) * 8));
        std::operator+(&closeLoopString,"aggregateRegister[",&productString);
        std::operator+(&loopString,&closeLoopString,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&loopString);
        std::__cxx11::string::~string((string *)&closeLoopString);
        std::__cxx11::string::~string((string *)&productString);
      }
      if (*(char *)(lVar17 + -0x50 + lVar20 * 8) == '\x01') {
        std::__cxx11::to_string
                  (&productString,
                   *(unsigned_long *)
                    (*(long *)&(this->depLocalProductRemapping).
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data +
                    *(long *)(lVar17 + -0x48 + lVar20 * 8) * 8));
        std::operator+(&closeLoopString,"localRegister[",&productString);
        std::operator+(&loopString,&closeLoopString,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&loopString);
        std::__cxx11::string::~string((string *)&closeLoopString);
        std::__cxx11::string::~string((string *)&productString);
      }
      if (*(char *)(lVar17 + -0xf + lVar20 * 8) == '\x01') {
        std::operator+(&local_5e0,"aggregates_",this->viewName + *(long *)(lVar17 + -8 + lVar20 * 8)
                      );
        std::operator+(&closeLoopString,&local_5e0,"[");
        std::__cxx11::to_string
                  ((string *)&increasingIndexes,*(unsigned_long *)(lVar17 + lVar20 * 8));
        std::operator+(&loopString,&closeLoopString,(string *)&increasingIndexes);
        std::operator+(&productString,&loopString,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&productString);
        std::__cxx11::string::~string((string *)&loopString);
        std::__cxx11::string::~string((string *)&increasingIndexes);
        std::__cxx11::string::~string((string *)&closeLoopString);
        std::__cxx11::string::~string((string *)&local_5e0);
      }
      uVar16 = *(ulong *)(lVar17 + -0x30 + lVar20 * 8);
      if (uVar16 < (ulong)(((long)(this->depListOfLoops).
                                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->depListOfLoops).
                                 super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                                 _M_impl.super__Vector_impl_data._M_start) / 0x138)) {
        std::__cxx11::to_string
                  (&productString,
                   *(unsigned_long *)
                    (*(long *)(*(long *)&(this->newAggregateRemapping).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[sVar18].
                                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         ._M_impl.super__Vector_impl_data + uVar16 * 0x18) +
                    *(long *)(lVar17 + -0x28 + lVar20 * 8) * 8));
        std::operator+(&closeLoopString,"aggregateRegister[",&productString);
        std::operator+(&loopString,&closeLoopString,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&loopString);
        std::__cxx11::string::~string((string *)&closeLoopString);
        std::__cxx11::string::~string((string *)&productString);
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      sVar11 = this->aggregateCounter;
      *(size_t *)
       (*(long *)&(this->depAggregateRemapping).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data + uVar12 * 8) = sVar11;
      uVar16 = sVar11 + 1;
      this->aggregateCounter = uVar16;
    }
    uVar12 = uVar12 + 1;
    lVar20 = lVar20 + 0xe;
  }
  if (uVar24 < uVar16) {
    sVar10 = local_458 + 2;
    if (local_190 == 0) {
      sVar10 = local_570 + 3;
    }
    offset_abi_cxx11_((string *)&off,this,sVar10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &increasingIndexes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                   "memset(&aggregateRegister[");
    std::__cxx11::to_string(&local_4f0,uVar24);
    std::operator+(&local_5e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &increasingIndexes,&local_4f0);
    std::operator+(&closeLoopString,&local_5e0,"], 0, sizeof(double) * ");
    std::__cxx11::to_string(&local_568,this->aggregateCounter - uVar24);
    std::operator+(&loopString,&closeLoopString,&local_568);
    std::operator+(&productString,&loopString,");\n");
    std::__cxx11::string::append((string *)resetString);
    std::__cxx11::string::~string((string *)&productString);
    std::__cxx11::string::~string((string *)&loopString);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&closeLoopString);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&increasingIndexes);
    std::__cxx11::string::~string((string *)&off);
  }
  sVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                    (&pDVar1[currentLoop].outView);
  local_570 = local_570 + 1;
  outViewID = sVar9;
  do {
    if (sVar9 == 0xffffffffffffffff) {
      std::__cxx11::string::~string((string *)&depthString);
      return __return_storage_ptr__;
    }
    pVVar13 = QueryCompiler::getView
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,sVar9);
    std::__cxx11::string::string((string *)&closeLoopString,"",(allocator *)&productString);
    for (uVar24 = 0; uVar24 != 100; uVar24 = uVar24 + 1) {
      uVar16 = uVar24 >> 6;
      uVar12 = 1L << ((byte)uVar24 & 0x3f);
      if (((pVVar13->_fVars).super__Base_bitset<2UL>._M_w[uVar16] >> (uVar24 & 0x3f) & 1) != 0) {
        if (((node->_bag).super__Base_bitset<2UL>._M_w[uVar16] & uVar12) == 0) {
          psVar5 = this->incomingViews[sVar9].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (psVar23 = this->incomingViews[sVar9].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; psVar23 != psVar5; psVar23 = psVar23 + 1)
          {
            pVVar15 = QueryCompiler::getView
                                ((this->_qc).
                                 super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,*psVar23);
            if (((pVVar15->_fVars).super__Base_bitset<2UL>._M_w[uVar16] & uVar12) != 0) {
              std::operator+(&local_5e0,this->viewName + *psVar23,"Tuple.");
              pAVar14 = TreeDecomposition::getAttribute
                                  ((this->_td).
                                   super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,uVar24);
              std::operator+(&loopString,&local_5e0,&pAVar14->_name);
              std::operator+(&productString,&loopString,",");
              std::__cxx11::string::append((string *)&closeLoopString);
              goto LAB_001b67e7;
            }
          }
        }
        else {
          std::operator+(&local_5e0,&node->_name,"Tuple.");
          pAVar14 = TreeDecomposition::getAttribute
                              ((this->_td).
                               super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,uVar24);
          std::operator+(&loopString,&local_5e0,&pAVar14->_name);
          std::operator+(&productString,&loopString,",");
          std::__cxx11::string::append((string *)&closeLoopString);
LAB_001b67e7:
          std::__cxx11::string::~string((string *)&productString);
          std::__cxx11::string::~string((string *)&loopString);
          std::__cxx11::string::~string((string *)&local_5e0);
        }
      }
    }
    std::__cxx11::string::pop_back();
    sVar10 = maxDepth;
    sVar18 = local_458 + 3 + (ulong)(local_570 < maxDepth);
    if (this->_requireHashing[sVar9] == false) {
      offset_abi_cxx11_(&local_3f0,this,sVar18);
      std::operator+(&local_450,&local_3f0,this->viewName + sVar9);
      std::operator+(&local_478,&local_450,".emplace_back(");
      std::operator+(&local_430,&local_478,&closeLoopString);
      std::operator+(&local_568,&local_430,");\n");
      offset_abi_cxx11_(&local_410,this,sVar18);
      std::operator+(&local_4f0,&local_568,&local_410);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                     &local_4f0,"aggregates_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                     this->viewName + sVar9);
      std::operator+(&local_5e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes," = ");
      std::operator+(&loopString,&local_5e0,this->viewName + sVar9);
      std::operator+(&productString,&loopString,".back().aggregates;\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&productString);
      std::__cxx11::string::~string((string *)&loopString);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&increasingIndexes);
      std::__cxx11::string::~string((string *)&off);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_450);
      this_00 = &local_3f0;
    }
    else {
      offset_abi_cxx11_(&local_290,this,sVar18);
      std::operator+(&local_3d0,&local_290,this->viewName + sVar9);
      std::operator+(&local_170,&local_3d0,"_iterator = ");
      std::operator+(&local_270,&local_170,this->viewName + sVar9);
      std::operator+(&local_150,&local_270,"_map.find({");
      std::operator+(&local_250,&local_150,&closeLoopString);
      std::operator+(&local_3b0,&local_250,"});\n");
      offset_abi_cxx11_(&local_2b0,this,sVar18);
      std::operator+(&local_390,&local_3b0,&local_2b0);
      std::operator+(&local_230,&local_390,"if (");
      std::operator+(&local_370,&local_230,this->viewName + sVar9);
      std::operator+(&local_210,&local_370,"_iterator != ");
      std::operator+(&local_350,&local_210,this->viewName + sVar9);
      std::operator+(&local_330,&local_350,"_map.end())\n");
      offset_abi_cxx11_(&local_2d0,this,sVar18 + 1);
      std::operator+(&local_1f0,&local_330,&local_2d0);
      std::operator+(&local_1d0,&local_1f0,"aggregates_");
      std::operator+(&local_310,&local_1d0,this->viewName + sVar9);
      std::operator+(&local_1b0,&local_310," = &");
      std::operator+(&local_410,&local_1b0,this->viewName + sVar9);
      std::operator+(&local_3f0,&local_410,"_iterator->second.aggregates[0];\n");
      offset_abi_cxx11_(&local_2f0,this,sVar18);
      std::operator+(&local_450,&local_3f0,&local_2f0);
      std::operator+(&local_478,&local_450,"else\n");
      offset_abi_cxx11_(&local_f0,this,sVar18 + 1);
      std::operator+(&local_430,&local_478,&local_f0);
      std::operator+(&local_568,&local_430,"aggregates_");
      std::operator+(&local_4f0,&local_568,this->viewName + sVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                     &local_4f0," = &");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                     this->viewName + sVar9);
      std::operator+(&local_5e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &increasingIndexes,"_map.insert({{");
      std::operator+(&loopString,&local_5e0,&closeLoopString);
      std::operator+(&productString,&loopString,"},{}}).first->second.aggregates[0];\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&productString);
      std::__cxx11::string::~string((string *)&loopString);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&increasingIndexes);
      std::__cxx11::string::~string((string *)&off);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_3d0);
      this_00 = &local_290;
    }
    std::__cxx11::string::~string((string *)this_00);
    if (multifaq::cppgen::COMPRESS_AGGREGATES == '\x01') {
      productString._M_dataplus._M_p = (pointer)0x0;
      loopString._M_dataplus._M_p = (pointer)0x0;
      increasingIndexes.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
      mapAggregateToIndexes
                (this,(AggregateIndexes *)&productString,
                 (this->aggregateComputation).
                 super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar9].
                 super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                 super__Vector_impl_data._M_start,&outViewID,&maxDepth);
      off = 0;
      lVar20 = 0x238;
      uVar24 = 1;
      while( true ) {
        pvVar6 = (this->aggregateComputation).
                 super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = *(long *)&pvVar6[sVar9].
                           super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>.
                           _M_impl.super__Vector_impl_data;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pvVar6[sVar9].
                                    super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>
                                    ._M_impl.super__Vector_impl_data + 8) - lVar17) / 0x238) <=
            uVar24) break;
        loopString.field_2._M_allocated_capacity = 0;
        loopString.field_2._8_8_ = 0;
        loopString._M_dataplus._M_p = (pointer)0x0;
        loopString._M_string_length = 0;
        mapAggregateToIndexes
                  (this,(AggregateIndexes *)&loopString,(AggregateTuple *)(lVar17 + lVar20),
                   &outViewID,&maxDepth);
        bVar8 = AggregateIndexes::isIncrement
                          ((AggregateIndexes *)&loopString,(AggregateIndexes *)&productString,&off,
                           &increasingIndexes);
        if (bVar8) {
          off = off + 1;
        }
        else {
          outputFinalRegTupleString_abi_cxx11_
                    (&local_5e0,this,(AggregateIndexes *)&productString,off,&increasingIndexes,
                     sVar18);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_5e0);
          psVar21 = &loopString;
          pAVar22 = (AggregateIndexes *)&productString;
          for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pAVar22->present).super__Base_bitset<1UL>._M_w = (_WordT)(psVar21->_M_dataplus)._M_p;
            psVar21 = (string *)((long)psVar21 + (ulong)bVar25 * -0x10 + 8);
            pAVar22 = (AggregateIndexes *)((long)pAVar22 + (ulong)bVar25 * -0x10 + 8);
          }
          off = 0;
          increasingIndexes.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
        }
        uVar24 = uVar24 + 1;
        lVar20 = lVar20 + 0x238;
      }
      outputFinalRegTupleString_abi_cxx11_
                (&local_5e0,this,(AggregateIndexes *)&productString,off,&increasingIndexes,sVar18);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_5e0);
    }
    else {
      pvVar6 = (this->aggregateComputation).
               super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar7 = *(pointer *)
                ((long)&pvVar6[sVar9].
                        super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (pAVar19 = pvVar6[sVar9].
                     super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                     super__Vector_impl_data._M_start; pAVar19 != pAVar7; pAVar19 = pAVar19 + 1) {
        offset_abi_cxx11_(&local_4f0,this,sVar18);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                       &local_4f0,"aggregates_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &increasingIndexes,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&off,
                       this->viewName + sVar9);
        std::operator+(&local_5e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &increasingIndexes,"[");
        std::__cxx11::to_string(&local_568,pAVar19->aggID);
        std::operator+(&loopString,&local_5e0,&local_568);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &productString,&loopString,"] += ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&productString);
        std::__cxx11::string::~string((string *)&loopString);
        std::__cxx11::string::~string((string *)&local_568);
        std::__cxx11::string::~string((string *)&local_5e0);
        std::__cxx11::string::~string((string *)&increasingIndexes);
        std::__cxx11::string::~string((string *)&off);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::string((string *)&productString,"",(allocator *)&loopString);
        uVar24 = (pAVar19->local).first;
        if (uVar24 < sVar10) {
          lVar20 = *(long *)&(this->productToVariableRegister).
                             super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar24].
                             super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>
                             ._M_impl.super__Vector_impl_data;
          lVar17 = (pAVar19->local).second * 0x100;
          std::__cxx11::to_string
                    (&loopString,
                     *(unsigned_long *)
                      (*(long *)(*(long *)&(this->newAggregateRemapping).
                                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                           ._M_impl.super__Vector_impl_data +
                                *(long *)(lVar20 + 0xe8 + lVar17) * 0x18) +
                      *(long *)(lVar20 + 0xf0 + lVar17) * 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &increasingIndexes,"aggregateRegister[",&loopString);
          std::operator+(&local_5e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &increasingIndexes,"]*");
          std::__cxx11::string::append((string *)&productString);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::__cxx11::string::~string((string *)&increasingIndexes);
          std::__cxx11::string::~string((string *)&loopString);
        }
        uVar24 = (pAVar19->post).first;
        if (uVar24 < sVar10) {
          std::__cxx11::to_string
                    (&loopString,
                     *(unsigned_long *)
                      (*(long *)&(this->postRemapping).
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data + (pAVar19->post).second * 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &increasingIndexes,"postRegister[",&loopString);
          std::operator+(&local_5e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &increasingIndexes,"]*");
          std::__cxx11::string::append((string *)&productString);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::__cxx11::string::~string((string *)&increasingIndexes);
          std::__cxx11::string::~string((string *)&loopString);
        }
        if (pAVar19->hasDependentComputation == true) {
          std::__cxx11::to_string
                    (&loopString,
                     *(unsigned_long *)
                      (*(long *)&(this->depAggregateRemapping).
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start
                                 [(pAVar19->dependentProdAgg).correspondingLoopAgg.first].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data +
                      (pAVar19->dependentProdAgg).correspondingLoopAgg.second * 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &increasingIndexes,"aggregateRegister[",&loopString);
          std::operator+(&local_5e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &increasingIndexes,"]*");
          std::__cxx11::string::append((string *)&productString);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::__cxx11::string::~string((string *)&increasingIndexes);
          std::__cxx11::string::~string((string *)&loopString);
        }
        if (productString._M_string_length == 0) {
          std::__cxx11::string::assign((char *)&productString);
        }
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::pop_back();
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&productString);
      }
    }
    sVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                      (&pDVar1[currentLoop].outView,sVar9);
    outViewID = sVar9;
    std::__cxx11::string::~string((string *)&closeLoopString);
  } while( true );
}

Assistant:

std::string CppGenerator::genDependentAggLoopString(
    const TDNode& node, const size_t currentLoop,size_t depth,
    const dyn_bitset& contributingViews, const size_t maxDepth,std::string& resetString)
{
    const size_t thisLoopID = currentLoop;

    const DependentLoop& depLoop = depListOfLoops[thisLoopID];
    const dyn_bitset& thisLoop = depLoop.loopFactors;

    size_t numOfLoops = thisLoop.count();

    std::string returnString = "";

    std::string depthString = std::to_string(depth);
        
    // Print all products for this considered loop
    for (size_t prodID = 0; prodID < localProductList[thisLoopID].size(); ++prodID)
    {
        const prod_bitset& product = localProductList[thisLoopID][prodID];

        // We turn the product into a string 
        std::string productString = genProductString(node,contributingViews,product);

        returnString += offset(3+depth+numOfLoops)+"localRegister["+
            std::to_string(productCounter)+"] = "+productString+";\n";
        
        // increment the counter and update the remapping array
        depLocalProductRemapping[thisLoopID][prodID] = productCounter;
        ++productCounter;
    }

    // for (size_t viewProd = 0; viewProd < viewProductList[thisLoopID].size();
    // ++viewProd)
    // {
    //     std::string viewProduct = "";
    //     for (const std::pair<size_t, size_t>& viewAgg :
    //              viewProductList[thisLoopID][viewProd])
    //     {
    //         viewProduct += "aggregates_"+viewName[viewAgg.first]+"["+
    //             std::to_string(viewAgg.second)+"]*";
    //     }   
    //     viewProduct.pop_back();
    //     returnString += offset(3+depth+numOfLoops)+
    //         "viewRegister["+std::to_string(viewCounter)+"] = "+
    //         viewProduct +";\n";
    //     // Increment the counter and update the remapping array
    //     viewProductRemapping[thisLoopID][viewProd] = viewCounter;
    //     ++viewCounter;
    // }    
    
    for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
    {        
        const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
        if (regTuple.preLoopAgg)
        {
            // We use a mapping to the correct index
            returnString += offset(3+depth+numOfLoops)+
                "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";

            if (regTuple.previous.first < depListOfLoops.size())
            {
                std::string prev = std::to_string(
                    depAggregateRemapping[regTuple.previous.first]
                    [regTuple.previous.second]);
                
                returnString += "aggregateRegister["+prev+"]*";
            }

            if (regTuple.product.first)
            {
                std::string local = std::to_string(
                    depLocalProductRemapping[thisLoopID][regTuple.product.second]
                    );
                returnString += "localRegister["+local+"]*";
            }
            
            if (regTuple.singleViewAgg)
            {
                returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                    std::to_string(regTuple.viewAgg.second)+"]*";
            }
            
            returnString.pop_back();
            returnString += ";\n";

            // Increment the counter and update the remapping array
            depAggregateRemapping[thisLoopID][aggID] = aggregateCounter;
            ++aggregateCounter;

        }
    }

    
    // Recurse to the next loop(s) if possible
    for (size_t next=0; next < depLoop.next.size(); ++next)
    {
        size_t nextLoop = depLoop.next[next];
        DependentLoop& nextDepLoop = depListOfLoops[nextLoop];
        
        if (((nextDepLoop.loopFactors & thisLoop) == thisLoop))
        {
            size_t viewID = nextDepLoop.loopVariable;

            std::string resetAggregates = "";
            std::string loopString = "", closeLoopString = "";
            if (viewID < _qc->numberOfViews())
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+viewName[viewID]+
                    " = lowerptr_"+viewName[viewID]+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+viewName[viewID]+
                    " <= upperptr_"+viewName[viewID]+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+viewName[viewID]+
                    "_tuple &"+viewName[viewID]+"Tuple = "+viewName[viewID]+
                    "[ptr_"+viewName[viewID]+"];\n"+
                    offset(4+depth+numOfLoops)+"double *aggregates_"+viewName[viewID]+
                    " = "+viewName[viewID]+"Tuple.aggregates;\n";
                
                closeLoopString += offset(4+depth+numOfLoops)+"++ptr_"+viewName[viewID]+
                    ";\n"+offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }
            else 
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+node._name+
                    " = lowerptr_"+node._name+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+node._name+
                    " <= upperptr_"+node._name+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+node._name +
                    "_tuple &"+node._name+"Tuple = "+node._name+
                    "[ptr_"+node._name+"];\n";
                
                closeLoopString = offset(4+depth+numOfLoops)+"++ptr_"+node._name+";\n"+
                    offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }

            // std::cout<< "Call genDependentAggLoopString from 1 \n";
            loopString += genDependentAggLoopString(
                node, nextLoop, depth, contributingViews, maxDepth, resetAggregates);
            
            returnString += resetAggregates+loopString+closeLoopString;

            // After recurse, add the aggregates that have been added with post FLAG
            for (size_t aggID = 0; aggID <
                     newAggregateRegister[nextLoop].size(); ++aggID)
            {
                const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                if (regTuple.postLoopAgg)
                {

                    // TODO: TODO:  Make sure this is correct -- Can we use
                    // equality here?

                    // We use a mapping to the correct index
                    returnString += offset(3+depth+numOfLoops)+
                        "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";
                    
                    if (regTuple.previous.first < depListOfLoops.size())
                    {
                        std::string local = std::to_string(
                            newAggregateRemapping[depth]
                            [regTuple.previous.first]
                            [regTuple.previous.second]);
                        returnString += "aggregateRegister["+local+"]*";
                    }

                    if (regTuple.postLoop.first < depListOfLoops.size())
                    {
                        std::string post = std::to_string(
                            newAggregateRemapping[depth][regTuple.postLoop.first]
                            [regTuple.postLoop.second]); 
                        returnString += "aggregateRegister["+post+"]*";
                    }
                    
                    returnString.pop_back();
                    returnString += ";\n";
            
                    // Increment the counter and update the remapping array
                    depAggregateRemapping[nextLoop][aggID] = aggregateCounter;
                    ++aggregateCounter;
                }
            }
        }
        else break;
    }


    size_t startingOffset = aggregateCounter;

    for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
    {
        const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
        if (!regTuple.postLoopAgg && !regTuple.preLoopAgg)
        {
            // We use a mapping to the correct index
            returnString += offset(3+depth+numOfLoops)+
                "aggregateRegister["+std::to_string(aggregateCounter)+"] += ";

            if (regTuple.previous.first < depListOfLoops.size())
            {
                std::string prev = std::to_string(
                    depAggregateRemapping[regTuple.previous.first]
                    [regTuple.previous.second]);
                
                returnString += "aggregateRegister["+prev+"]*";
            }
            
            if (regTuple.product.first)
            {
                std::string local = std::to_string(
                    depLocalProductRemapping[thisLoopID][regTuple.product.second]
                    );
                returnString += "localRegister["+local+"]*";
            }
        
            if (regTuple.singleViewAgg)
            {
                returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                    std::to_string(regTuple.viewAgg.second)+"]*";
            }
            
            if (regTuple.postLoop.first < depListOfLoops.size())
            {
                std::string postLoop = std::to_string(
                    newAggregateRemapping[depth][regTuple.postLoop.first]
                    [regTuple.postLoop.second]);
                returnString += "aggregateRegister["+postLoop+"]*";
            }
            
            returnString.pop_back();
            returnString += ";\n";
            
            // Increment the counter and update the remapping array
            depAggregateRemapping[thisLoopID][aggID] = aggregateCounter;
            ++aggregateCounter;
        }
    }

    if (aggregateCounter > startingOffset)
    {
        size_t resetOffset = (numOfLoops == 0 ? 3+depth : 2+depth+numOfLoops);
        resetString += offset(resetOffset)+"memset(&aggregateRegister["+
            std::to_string(startingOffset)+"], 0, sizeof(double) * "+
            std::to_string(aggregateCounter-startingOffset)+");\n";
    }
    
    size_t outViewID = depLoop.outView.find_first();
    while (outViewID != boost::dynamic_bitset<>::npos)
    {
        View* view = _qc->getView(outViewID);
        
        // Add the code that outputs tuples for the views           
        std::string viewVars = "";            
        for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
        {
            if (view->_fVars[v])
            {
                if (node._bag[v])
                {
                    viewVars += node._name+"Tuple."+
                        _td->getAttribute(v)->_name+",";
                }
                else
                {
                    for (const size_t& incViewID : incomingViews[outViewID])
                    {
                        View* view = _qc->getView(incViewID);
                        if (view->_fVars[v])
                        {
                            viewVars += viewName[incViewID]+"Tuple."+
                                _td->getAttribute(v)->_name+",";
                            break;
                        }
                    }
                }
            }
        }
        viewVars.pop_back();

        // size_t offDepth = numOfLoops+depth+3;
        size_t offDepth = (depth + 1 < maxDepth ?
                           4+depth+numOfLoops : 3+depth+numOfLoops);
        
        if (_requireHashing[outViewID])
        {

            returnString +=
                offset(offDepth)+viewName[outViewID]+"_iterator = "+
                viewName[outViewID]+"_map.find({"+viewVars+"});\n"+
                offset(offDepth)+"if ("+viewName[outViewID]+"_iterator != "+
                viewName[outViewID]+"_map.end())\n"+
                offset(offDepth+1)+"aggregates_"+viewName[outViewID]+" = &"+
                viewName[outViewID]+"_iterator->second.aggregates[0];\n"+
                offset(offDepth)+"else\n"+
                offset(offDepth+1)+"aggregates_"+viewName[outViewID]+" = &"+
                viewName[outViewID]+"_map.insert({{"+viewVars+
                "},{}}).first->second.aggregates[0];\n";

            // This code is an alternative way to update the views that require hashing
            // returnString +=
            //     offset(offDepth)+viewName[outViewID]+"_pair = "+
            //     viewName[outViewID]+"_map.insert({{"+viewVars+"},"+
            //     viewName[outViewID]+".size()});\n"+
            //     offset(offDepth)+"if ("+viewName[outViewID]+"_pair.second)\n"+
            //     offset(offDepth)+"{\n"+
            //     offset(offDepth+1)+viewName[outViewID]+
            //     ".emplace_back("+viewVars+");\n"+
            //     offset(offDepth)+"}\n"+
            //     offset(offDepth)+"aggregates_"+viewName[outViewID]+
            //     " = "+viewName[outViewID]+"["+viewName[outViewID]+
            //     "_pair.first->second].aggregates;\n";

                // "//-----------------------------\n"+
                // offset(offDepth)+viewName[outViewID]+"_iterator"+
                // " = "+viewName[outViewID]+"_map.find({"+viewVars+"});\n"+
                // offset(offDepth)+"if ("+viewName[outViewID]+"_iterator"
                // " != "+viewName[outViewID]+"_map.end())\n"+
                // offset(offDepth)+"{\n"+
                // offset(offDepth+1)+"aggregates_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+"["+viewName[outViewID]+
                // "_iterator->second].aggregates;\n"+
                // offset(offDepth)+"}\n"+
                // offset(offDepth)+"else\n"+
                // offset(offDepth)+"{\n"+
                // offset(offDepth+1)+"size_t idx_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+".size();\n"+
                // offset(offDepth+1)+viewName[outViewID]+
                // // "_map.emplace("+viewVars+",idx_"+viewName[outViewID]+");\n"+
                // "_map[{"+viewVars+"}] = idx_"+viewName[outViewID]+";\n"+
                // offset(offDepth+1)+viewName[outViewID]+
                // ".emplace_back("+viewVars+");\n"+
                // // ".push_back({"+viewVars+"});\n"+
                // offset(offDepth+1)+"aggregates_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+"[idx_"+viewName[outViewID]+
                // "].aggregates;\n"+
                // offset(offDepth)+"}\n";
        }
        else
        {
            // just add string to push to view
            returnString += offset(offDepth)+viewName[outViewID]+
                ".emplace_back("+viewVars+");\n"+offset(offDepth)+
                // ".push_back({"+viewVars+"});\n"+offset(offDepth)+
                "aggregates_"+viewName[outViewID]+" = "+viewName[outViewID]+
                ".back().aggregates;\n";
        }

        if (COMPRESS_AGGREGATES)
        {
            AggregateIndexes bench, aggIdx;
            std::bitset<7> increasingIndexes;
        
            mapAggregateToIndexes(bench,aggregateComputation[outViewID][0],
                                  outViewID,maxDepth);
        
            size_t off = 0;
            for (size_t aggID = 1; aggID <
                     aggregateComputation[outViewID].size(); ++aggID)
            {
                const AggregateTuple& tuple = aggregateComputation[outViewID][aggID];

                aggIdx.reset();
                mapAggregateToIndexes(aggIdx,tuple,outViewID,maxDepth);

                // if (outViewID == 0)
                //     std::cout << aggID << " : " << increasingIndexes << std::endl;

                if (aggIdx.isIncrement(bench,off,increasingIndexes))
                {
                    ++off;
                }
                else
                {
                    // If not, output bench and all offset aggregates
                    returnString += outputFinalRegTupleString(
                        bench,off,increasingIndexes,offDepth);
                
                    // make aggregate the bench and set offset to 0
                    bench = aggIdx;
                    off = 0;
                    increasingIndexes.reset();
                }
            }

            // If not, output bench and all offset
            // aggregateString
            returnString += outputFinalRegTupleString(
                bench,off,increasingIndexes,offDepth);
        }
        else 
        {
            for(const AggregateTuple& aggTuple : aggregateComputation[outViewID])
            {
                returnString += offset(offDepth)+"aggregates_"+
                    viewName[outViewID]+"["+std::to_string(aggTuple.aggID)+
                    "] += ";

                std::string aggBody = "";
                if (aggTuple.local.first < maxDepth)
                {
                    const ProductAggregate& prodAgg =
                        productToVariableRegister[aggTuple.local.first]
                        [aggTuple.local.second];
        
                    const std::pair<size_t,size_t>& correspondingLoopAgg =
                        prodAgg.correspondingLoopAgg;
                    
                    std::string prev = std::to_string(
                        newAggregateRemapping[aggTuple.local.first]
                        [correspondingLoopAgg.first]
                        [correspondingLoopAgg.second]);
                
                    aggBody += "aggregateRegister["+prev+"]*";
                }
                if (aggTuple.post.first < maxDepth)
                {
                    std::string post = std::to_string(
                        postRemapping[aggTuple.post.first]
                        [aggTuple.post.second]);
                    aggBody += "postRegister["+post+"]*";
                }

                if (aggTuple.hasDependentComputation)
                {
                    const std::pair<size_t,size_t>& correspondingLoopAgg =
                        aggTuple.dependentProdAgg.correspondingLoopAgg;
                
                    std::string prev = std::to_string(
                        depAggregateRemapping[correspondingLoopAgg.first]
                        [correspondingLoopAgg.second]);

                    aggBody += "aggregateRegister["+prev+"]*";
                }
                // TODO:TODO:TODO: ---> make sure this is correct
                if (aggBody.empty())
                    aggBody = "1*";
                returnString += aggBody;
                returnString.pop_back();
                returnString += ";\n";            
            }
        }

        outViewID = depLoop.outView.find_next(outViewID);
    }

    return returnString;
}